

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void dwt_decode_1(dwt_t *v)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  
  piVar3 = v->mem;
  uVar1 = v->dn;
  lVar4 = (long)(int)uVar1;
  uVar2 = v->sn;
  lVar5 = (long)(int)uVar2;
  if (v->cas == 0) {
    if (0 < (int)uVar1 || 1 < (int)uVar2) {
      uVar7 = 0xffffffff;
      lVar8 = (long)(int)(uVar1 * 2 + -1);
      uVar9 = 0;
      uVar10 = 0;
      if (0 < (int)uVar2) {
        uVar10 = (ulong)uVar2;
      }
      lVar11 = 1;
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        piVar14 = piVar3 + 1;
        if ((uVar9 != 0) && (piVar14 = piVar3 + lVar8, (long)uVar9 <= lVar4)) {
          piVar14 = piVar3 + uVar7;
        }
        lVar13 = lVar8;
        if ((long)uVar9 < lVar4) {
          lVar13 = lVar11;
        }
        piVar3[uVar9 * 2] = piVar3[uVar9 * 2] - (*piVar14 + piVar3[lVar13] + 2 >> 2);
        uVar7 = uVar7 + 2;
        lVar11 = lVar11 + 2;
      }
      lVar4 = (long)(int)(uVar2 * 2 + -2);
      uVar10 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar10;
      }
      lVar8 = 2;
      iVar12 = 1;
      while (uVar9 != uVar10) {
        lVar11 = lVar8 + -2;
        if (lVar5 <= (long)uVar10) {
          lVar11 = lVar4;
        }
        uVar10 = uVar10 + 1;
        lVar13 = lVar4;
        if (iVar12 < (int)uVar2) {
          lVar13 = lVar8;
        }
        piVar3[lVar8 + -1] = piVar3[lVar8 + -1] + (piVar3[lVar13] + piVar3[lVar11] >> 1);
        lVar8 = lVar8 + 2;
        iVar12 = iVar12 + 1;
      }
    }
  }
  else if (uVar1 == 1 && uVar2 == 0) {
    *piVar3 = *piVar3 / 2;
  }
  else {
    lVar8 = (long)(int)(uVar1 * 2 + -2);
    uVar9 = 0;
    uVar10 = 0;
    if (0 < (int)uVar2) {
      uVar10 = (ulong)uVar2;
    }
    lVar11 = 2;
    iVar12 = 1;
    while (uVar10 != uVar9) {
      lVar13 = lVar11 + -2;
      if (lVar4 <= (long)uVar9) {
        lVar13 = lVar8;
      }
      uVar9 = uVar9 + 1;
      lVar6 = lVar8;
      if (iVar12 < (int)uVar1) {
        lVar6 = lVar11;
      }
      piVar3[lVar11 + -1] = piVar3[lVar11 + -1] - (piVar3[lVar13] + piVar3[lVar6] + 2 >> 2);
      lVar11 = lVar11 + 2;
      iVar12 = iVar12 + 1;
    }
    uVar7 = 0xffffffff;
    lVar4 = (long)(int)(uVar2 * 2 + -1);
    uVar10 = 0;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar10;
    }
    lVar8 = 1;
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      lVar11 = lVar4;
      if ((long)uVar10 < lVar5) {
        lVar11 = lVar8;
      }
      piVar14 = piVar3 + 1;
      if ((uVar10 != 0) && (piVar14 = piVar3 + lVar4, (long)uVar10 <= lVar5)) {
        piVar14 = piVar3 + uVar7;
      }
      piVar3[uVar10 * 2] = piVar3[uVar10 * 2] + (piVar3[lVar11] + *piVar14 >> 1);
      uVar7 = uVar7 + 2;
      lVar8 = lVar8 + 2;
    }
  }
  return;
}

Assistant:

static void dwt_decode_1(dwt_t *v) {
	dwt_decode_1_(v->mem, v->dn, v->sn, v->cas);
}